

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem_utils.cpp
# Opt level: O0

bool FileSysUtilsCombinePaths(string *parent,string *child,string *combined)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  char local_31;
  long lStack_30;
  char last_char;
  size_type parent_len;
  string *combined_local;
  string *child_local;
  string *parent_local;
  
  parent_len = (size_type)combined;
  combined_local = child;
  child_local = parent;
  lStack_30 = std::__cxx11::string::length();
  if (((lStack_30 != 0) && (bVar1 = std::operator==(".",child_local), !bVar1)) &&
     (bVar1 = std::operator==("./",child_local), !bVar1)) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)child_local);
    local_31 = *pcVar2;
    if (local_31 == '/') {
      lStack_30 = lStack_30 + -1;
    }
    std::__cxx11::string::substr((ulong)&local_98,(ulong)child_local);
    std::operator+(&local_78,&local_98,'/');
    std::operator+(&local_58,&local_78,combined_local);
    std::__cxx11::string::operator=((string *)parent_len,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    return true;
  }
  std::__cxx11::string::operator=((string *)parent_len,(string *)combined_local);
  return true;
}

Assistant:

bool FileSysUtilsCombinePaths(const std::string& parent, const std::string& child, std::string& combined) {
    std::string::size_type parent_len = parent.length();
    if (0 == parent_len || "." == parent || "./" == parent) {
        combined = child;
        return true;
    }
    char last_char = parent[parent_len - 1];
    if (last_char == DIRECTORY_SYMBOL) {
        parent_len--;
    }
    combined = parent.substr(0, parent_len) + DIRECTORY_SYMBOL + child;
    return true;
}